

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O2

llb_buildsystem_tool_t *
llb_buildsystem_tool_create(llb_data_t *name,llb_buildsystem_tool_delegate_t delegate)

{
  Tool *this;
  StringRef name_00;
  
  if (delegate.create_command != (_func_llb_buildsystem_command_t_ptr_void_ptr_llb_data_t_ptr *)0x0)
  {
    this = (Tool *)operator_new(0x48);
    name_00.Length = name->length;
    name_00.Data = (char *)name->data;
    llbuild::buildsystem::Tool::Tool(this,name_00);
    this->_vptr_Tool = (_func_int **)&PTR__CAPITool_0022c0d8;
    this[1]._vptr_Tool = (_func_int **)delegate.context;
    this[1].name._M_dataplus._M_p = (pointer)delegate.create_command;
    this[1].name._M_string_length = (size_type)delegate.create_custom_command;
    this[1].name.field_2._M_allocated_capacity = (size_type)delegate.destroy_context;
    return (llb_buildsystem_tool_t *)this;
  }
  __assert_fail("delegate.create_command",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/products/libllbuild/BuildSystem-C-API.cpp"
                ,0x510,
                "llb_buildsystem_tool_t *llb_buildsystem_tool_create(const llb_data_t *, llb_buildsystem_tool_delegate_t)"
               );
}

Assistant:

llb_buildsystem_tool_t*
llb_buildsystem_tool_create(const llb_data_t* name,
                            llb_buildsystem_tool_delegate_t delegate) {
  // Check that all required methods are provided.
  assert(delegate.create_command);
  return (llb_buildsystem_tool_t*) new CAPITool(
      StringRef((const char*)name->data, name->length), delegate);
}